

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O0

void __thiscall Diligent::VAOCache::~VAOCache(VAOCache *this)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_70 [8];
  string msg_2;
  string msg_1;
  string msg;
  VAOCache *this_local;
  
  bVar1 = std::
          unordered_map<Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>_>
          ::empty(&this->m_Cache);
  if (!bVar1) {
    FormatString<char[58]>
              ((string *)((long)&msg_1.field_2 + 8),
               (char (*) [58])"VAO cache is not empty. Are there any unreleased objects?");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x39);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
          ::empty(&this->m_PSOToKey);
  if (!bVar1) {
    FormatString<char[27]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [27])"PSOToKey hash is not empty");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x3a);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar1 = std::
          unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
          ::empty(&this->m_BuffToKey);
  if (!bVar1) {
    FormatString<char[28]>((string *)local_70,(char (*) [28])"BuffToKey hash is not empty");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"~VAOCache",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
               ,0x3b);
    std::__cxx11::string::~string((string *)local_70);
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>::~GLObjWrapper
            (&this->m_EmptyVAO);
  std::
  unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
  ::~unordered_map(&this->m_BuffToKey);
  std::
  unordered_map<int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>_>
  ::~unordered_map(&this->m_PSOToKey);
  std::
  unordered_map<Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>_>
  ::~unordered_map(&this->m_Cache);
  return;
}

Assistant:

VAOCache::~VAOCache()
{
    VERIFY(m_Cache.empty(), "VAO cache is not empty. Are there any unreleased objects?");
    VERIFY(m_PSOToKey.empty(), "PSOToKey hash is not empty");
    VERIFY(m_BuffToKey.empty(), "BuffToKey hash is not empty");
}